

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O0

FieldAlignmentGroups * __thiscall
google::protobuf::compiler::cpp::MessageLayoutHelper::BuildFieldAlignmentGroups
          (FieldAlignmentGroups *__return_storage_ptr__,MessageLayoutHelper *this,
          FieldVector *fields,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  FieldDescriptor *field_00;
  bool bVar1;
  int iVar2;
  reference ppFVar3;
  reference pvVar4;
  reference pvVar5;
  LogMessage *pLVar6;
  string_view v;
  LogMessage local_c0;
  Voidify local_a9;
  undefined1 local_a8 [8];
  FieldGroup fg;
  FieldHotness hotness;
  FieldFamily f;
  FieldDescriptor *field;
  const_iterator __end3;
  const_iterator __begin3;
  FieldVector *__range3;
  undefined1 local_50 [8];
  vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  fast_path_fields;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  FieldVector *fields_local;
  MessageLayoutHelper *this_local;
  FieldAlignmentGroups *field_alignment_groups;
  
  fast_path_fields.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  FieldAlignmentGroups::FieldAlignmentGroups(__return_storage_ptr__);
  BuildFastParseTable((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                       *)local_50,this,options,scc_analyzer);
  __end3 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin(fields);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end(fields);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      fast_path_fields.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
      ::~vector((vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                 *)local_50);
      if ((fast_path_fields.
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        FieldAlignmentGroups::~FieldAlignmentGroups(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    ppFVar3 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end3);
    field_00 = *ppFVar3;
    fg.estimated_memory_size_ = GetFieldFamily(field_00,options,scc_analyzer);
    bVar1 = ShouldSplit(field_00,options);
    if (bVar1) {
      fg.preferred_location_ = 0.0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated(field_00);
      if (bVar1) {
        fg.preferred_location_ = 7.00649e-45;
      }
      else {
        fg.preferred_location_ =
             (float)(*this->_vptr_MessageLayoutHelper[4])(this,field_00,options,scc_analyzer);
        if ((fg.preferred_location_ != 1.4013e-45) &&
           (bVar1 = IsFastPathField(field_00,(vector<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
                                              *)local_50), bVar1)) {
          fg.preferred_location_ = 5.60519e-45;
        }
      }
    }
    (*this->_vptr_MessageLayoutHelper[5])(local_a8,this,field_00);
    iVar2 = EstimateAlignmentSize(field_00);
    if (iVar2 == 1) {
      pvVar4 = std::
               array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
               ::operator[](&__return_storage_ptr__->aligned_to_1,(ulong)fg.estimated_memory_size_);
      pvVar5 = std::
               array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
               ::operator[](pvVar4,(ulong)(uint)fg.preferred_location_);
      std::
      vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
      ::push_back(pvVar5,(value_type *)local_a8);
    }
    else if (iVar2 == 4) {
      pvVar4 = std::
               array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
               ::operator[](&__return_storage_ptr__->aligned_to_4,(ulong)fg.estimated_memory_size_);
      pvVar5 = std::
               array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
               ::operator[](pvVar4,(ulong)(uint)fg.preferred_location_);
      std::
      vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
      ::push_back(pvVar5,(value_type *)local_a8);
    }
    else {
      if (iVar2 != 8) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message_layout_helper.cc"
                   ,0xa4);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar6,(char (*) [24])"Unknown alignment size ");
        iVar2 = EstimateAlignmentSize(field_00);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,iVar2);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar6,(char (*) [11])0xa8edab);
        v = FieldDescriptor::full_name(field_00);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar6,v);
        pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                           (pLVar6,(char (*) [2])0xb7cf01);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar6);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_c0);
      }
      pvVar4 = std::
               array<std::array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>,_5UL>
               ::operator[](&__return_storage_ptr__->aligned_to_8,(ulong)fg.estimated_memory_size_);
      pvVar5 = std::
               array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
               ::operator[](pvVar4,(ulong)(uint)fg.preferred_location_);
      std::
      vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
      ::push_back(pvVar5,(value_type *)local_a8);
    }
    FieldGroup::~FieldGroup((FieldGroup *)local_a8);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end3);
  } while( true );
}

Assistant:

MessageLayoutHelper::FieldAlignmentGroups
MessageLayoutHelper::BuildFieldAlignmentGroups(
    const FieldVector& fields, const Options& options,
    MessageSCCAnalyzer* scc_analyzer) const {
  FieldAlignmentGroups field_alignment_groups;
  const auto fast_path_fields = BuildFastParseTable(options, scc_analyzer);

  for (const auto* field : fields) {
    FieldFamily f = GetFieldFamily(field, options, scc_analyzer);

    FieldHotness hotness;
    if (ShouldSplit(field, options)) {
      hotness = kSplit;
    } else if (field->is_repeated()) {
      hotness = kRepeated;
    } else {
      hotness = GetFieldHotness(field, options, scc_analyzer);

      if (hotness != kCold && IsFastPathField(field, fast_path_fields)) {
        hotness = kFastParse;
      }
    }

    FieldGroup fg = SingleFieldGroup(field);
    switch (EstimateAlignmentSize(field)) {
      case 1:
        field_alignment_groups.aligned_to_1[f][hotness].push_back(fg);
        break;
      case 4:
        field_alignment_groups.aligned_to_4[f][hotness].push_back(fg);
        break;
      case 8:
        field_alignment_groups.aligned_to_8[f][hotness].push_back(fg);
        break;
      default:
        ABSL_LOG(FATAL) << "Unknown alignment size "
                        << EstimateAlignmentSize(field) << "for field "
                        << field->full_name() << ".";
    }
  }

  return field_alignment_groups;
}